

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

bool __thiscall
level_mesh::check_regular_regular_contacts
          (level_mesh *this,AABBTreeCollider *tc,b_submesh *sm,b_submesh *sm1)

{
  bool bVar1;
  Pair *pPVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  b_face *face1_2;
  b_face *face_2;
  Pair *end_2;
  Pair *pair_2;
  b_face *face1_1;
  b_face *face_1;
  int index;
  Pair *end_1;
  Pair *pair_1;
  b_face *face1;
  b_face *face;
  Pair *end;
  Pair *pair;
  b_submesh *sm1_local;
  b_submesh *sm_local;
  AABBTreeCollider *tc_local;
  level_mesh *this_local;
  
  if ((tc->mPairs).mCurNbEntries >> 1 == 0) {
    __assert_fail("tc.GetNbPairs()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                  ,0x2ce,
                  "bool level_mesh::check_regular_regular_contacts(const Opcode::AABBTreeCollider &, const b_submesh *, const b_submesh *) const"
                 );
  }
  if ((this->m_restricted_merge & 1U) == 0) {
    if ((this->m_aggressive_merge & 1U) == 0) {
      end_2 = (Pair *)(tc->mPairs).mEntries;
      pPVar2 = end_2 + ((tc->mPairs).mCurNbEntries >> 1);
      while( true ) {
        if (end_2 == pPVar2) {
          return false;
        }
        pvVar3 = std::
                 vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ::operator[](&(this->super_xr_mesh_builder).m_faces,
                              (ulong)(end_2->id0 + (sm->super_b_model_instance).min_face));
        pvVar4 = std::
                 vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ::operator[](&(this->super_xr_mesh_builder).m_faces,
                              (ulong)(end_2->id1 + (sm1->super_b_model_instance).min_face));
        if (*(short *)&pvVar3->field_1 == *(short *)&pvVar4->field_1) break;
        end_2 = end_2 + 1;
      }
      return true;
    }
    end_1 = (Pair *)(tc->mPairs).mEntries;
    pPVar2 = end_1 + ((tc->mPairs).mCurNbEntries >> 1);
    for (; end_1 != pPVar2; end_1 = end_1 + 1) {
      face_1._4_4_ = end_1->id0 + (sm->super_b_model_instance).min_face;
      if ((sm->super_b_model_instance).max_face < face_1._4_4_) {
        face_1._4_4_ = (sm->super_b_model_instance).max_face;
      }
      pvVar3 = std::
               vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ::operator[](&(this->super_xr_mesh_builder).m_faces,(long)(int)face_1._4_4_);
      bVar1 = check_match(&this->m_inadhesive_shaders,*(uint16_t *)((long)&pvVar3->field_1 + 2));
      if (bVar1) {
        return false;
      }
      face_1._4_4_ = end_1->id1 + (sm1->super_b_model_instance).min_face;
      if ((sm1->super_b_model_instance).max_face < face_1._4_4_) {
        face_1._4_4_ = (sm1->super_b_model_instance).max_face;
      }
      pvVar3 = std::
               vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ::operator[](&(this->super_xr_mesh_builder).m_faces,(long)(int)face_1._4_4_);
      bVar1 = check_match(&this->m_inadhesive_shaders,*(uint16_t *)((long)&pvVar3->field_1 + 2));
      if (bVar1) {
        return false;
      }
    }
  }
  else {
    end = (Pair *)(tc->mPairs).mEntries;
    pPVar2 = end + ((tc->mPairs).mCurNbEntries >> 1);
    for (; end != pPVar2; end = end + 1) {
      pvVar3 = std::
               vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ::operator[](&(this->super_xr_mesh_builder).m_faces,
                            (ulong)(end->id0 + (sm->super_b_model_instance).min_face));
      pvVar4 = std::
               vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ::operator[](&(this->super_xr_mesh_builder).m_faces,
                            (ulong)(end->id1 + (sm1->super_b_model_instance).min_face));
      if (*(short *)&pvVar3->field_1 != *(short *)&pvVar4->field_1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool level_mesh::check_regular_regular_contacts(const Opcode::AABBTreeCollider& tc,
		const b_submesh* sm, const b_submesh* sm1) const
{
	xr_assert(tc.GetNbPairs());
	if (m_restricted_merge) {
		for (const Pair *pair = tc.GetPairs(), *end = pair + tc.GetNbPairs(); pair != end; ++pair) {
			const b_face& face = m_faces[pair->id0 + sm->min_face];
			const b_face& face1 = m_faces[pair->id1 + sm1->min_face];
			if (face.surface.texture != face1.surface.texture)
				return false;
		}
	} else if (m_aggressive_merge) {
		for (const Pair *pair = tc.GetPairs(), *end = pair + tc.GetNbPairs(); pair != end; ++pair) {

			int index = pair->id0 + sm->min_face;
			if (index > sm->max_face)// by // FIXME: hack to handle 1-face meshes
				index = sm->max_face;
			const b_face& face = m_faces[index];
			if (check_match(m_inadhesive_shaders, face.surface.eshader))
				return false;

			index = pair->id1 + sm1->min_face;
			if (index > sm1->max_face)// by // FIXME: hack to handle 1-face meshes
				index = sm1->max_face;

			const b_face& face1 = m_faces[index];
			if (check_match(m_inadhesive_shaders, face1.surface.eshader))
				return false;
		}
	} else {
		for (const Pair *pair = tc.GetPairs(), *end = pair + tc.GetNbPairs(); pair != end; ++pair) {
			const b_face& face = m_faces[pair->id0 + sm->min_face];
			const b_face& face1 = m_faces[pair->id1 + sm1->min_face];
			if (face.surface.texture == face1.surface.texture)
				return true;
		}
		return false;
	}
	return true;
}